

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O0

int __thiscall
vkt::memory::anon_unknown_0::BufferCopyToImage::verify
          (BufferCopyToImage *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,
          size_t tbslen)

{
  VkCommandBuffer_s *pVVar1;
  RefData<vk::VkCommandBuffer_s_*> data_00;
  RefData<vk::Handle<(vk::HandleType)8>_> data_01;
  RefData<vk::Handle<(vk::HandleType)7>_> data_02;
  bool bVar2;
  deUint8 dVar3;
  deUint8 dVar4;
  VkResult result;
  int iVar5;
  int extraout_EAX;
  ResultCollector *this_00;
  ReferenceMemory *this_01;
  Context *pCVar6;
  InstanceInterface *vki_00;
  DeviceInterface *vkd_00;
  VkPhysicalDevice physicalDevice_00;
  VkDevice device_00;
  VkQueue queue_00;
  Handle<(vk::HandleType)8> *pHVar7;
  VkCommandBuffer_s **ppVVar8;
  Handle<(vk::HandleType)9> *pHVar9;
  Handle<(vk::HandleType)7> *pHVar10;
  undefined4 extraout_var;
  Hex<8UL> *value;
  Hex<8UL> *value_00;
  string local_440;
  deUint64 local_420;
  string local_418;
  deUint64 local_3f8;
  string local_3f0;
  string local_3d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  unsigned_long local_2b0;
  size_t pos;
  deUint8 *data;
  deUint64 local_298;
  void *local_290;
  void *ptr;
  deUint64 local_280;
  undefined8 local_278;
  VkBufferImageCopy region;
  VkBufferMemoryBarrier bufferBarrier;
  VkImageMemoryBarrier imageBarrier;
  Move<vk::Handle<(vk::HandleType)7>_> local_1b8;
  RefData<vk::Handle<(vk::HandleType)7>_> local_198;
  undefined1 local_178 [8];
  Unique<vk::Handle<(vk::HandleType)7>_> memory;
  RefData<vk::Handle<(vk::HandleType)8>_> local_138;
  undefined1 local_118 [8];
  Unique<vk::Handle<(vk::HandleType)8>_> dstBuffer;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *queueFamilies;
  Move<vk::VkCommandBuffer_s_*> local_c0;
  RefData<vk::VkCommandBuffer_s_*> local_a0;
  undefined1 local_80 [8];
  Unique<vk::VkCommandBuffer_s_*> commandBuffer;
  VkCommandPool commandPool;
  VkQueue queue;
  VkDevice device;
  VkPhysicalDevice physicalDevice;
  DeviceInterface *vkd;
  InstanceInterface *vki;
  ReferenceMemory_conflict *reference;
  ResultCollector *resultCollector;
  size_t commandIndex_local;
  VerifyContext *context_local;
  BufferCopyToImage *this_local;
  
  resultCollector = (ResultCollector *)sig;
  commandIndex_local = (size_t)ctx;
  context_local = (VerifyContext *)this;
  this_00 = VerifyContext::getResultCollector((VerifyContext *)ctx);
  this_01 = (ReferenceMemory *)VerifyContext::getReference((VerifyContext *)commandIndex_local);
  pCVar6 = VerifyContext::getContext((VerifyContext *)commandIndex_local);
  vki_00 = Context::getInstanceInterface(pCVar6);
  pCVar6 = VerifyContext::getContext((VerifyContext *)commandIndex_local);
  vkd_00 = Context::getDeviceInterface(pCVar6);
  pCVar6 = VerifyContext::getContext((VerifyContext *)commandIndex_local);
  physicalDevice_00 = Context::getPhysicalDevice(pCVar6);
  pCVar6 = VerifyContext::getContext((VerifyContext *)commandIndex_local);
  device_00 = Context::getDevice(pCVar6);
  pCVar6 = VerifyContext::getContext((VerifyContext *)commandIndex_local);
  queue_00 = Context::getQueue(pCVar6);
  pCVar6 = VerifyContext::getContext((VerifyContext *)commandIndex_local);
  commandBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool =
       Context::getCommandPool(pCVar6);
  createBeginCommandBuffer
            (&local_c0,vkd_00,device_00,
             commandBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool,
             VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_a0,(Move *)&local_c0);
  data_00.deleter.m_deviceIface._0_4_ = (int)local_a0.deleter.m_deviceIface;
  data_00.object = local_a0.object;
  data_00.deleter.m_deviceIface._4_4_ = (int)((ulong)local_a0.deleter.m_deviceIface >> 0x20);
  data_00.deleter.m_device = local_a0.deleter.m_device;
  data_00.deleter.m_pool.m_internal._0_4_ = (int)local_a0.deleter.m_pool.m_internal;
  data_00.deleter.m_pool.m_internal._4_4_ = (int)(local_a0.deleter.m_pool.m_internal >> 0x20);
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_80,data_00);
  ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::~Move(&local_c0);
  pCVar6 = VerifyContext::getContext((VerifyContext *)commandIndex_local);
  Context::getQueueFamilies
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &dstBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator,
             pCVar6);
  createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)
               &memory.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_allocator,
               vkd_00,device_00,(long)(this->m_imageWidth * this->m_imageHeight * 4),2,
               VK_SHARING_MODE_EXCLUSIVE,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               &dstBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_138,
             (Move *)&memory.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.
                      m_allocator);
  data_01.deleter.m_deviceIface._0_4_ = (int)local_138.deleter.m_deviceIface;
  data_01.object.m_internal = local_138.object.m_internal;
  data_01.deleter.m_deviceIface._4_4_ = (int)((ulong)local_138.deleter.m_deviceIface >> 0x20);
  data_01.deleter.m_device = local_138.deleter.m_device;
  data_01.deleter.m_allocator._0_4_ = (int)local_138.deleter.m_allocator;
  data_01.deleter.m_allocator._4_4_ = (int)((ulong)local_138.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)8>_> *)local_118,data_01);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)8>_> *)
             &memory.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_allocator);
  pHVar7 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)8>_> *)local_118);
  bindBufferMemory(&local_1b8,vki_00,vkd_00,physicalDevice_00,device_00,(VkBuffer)pHVar7->m_internal
                   ,2);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_198,(Move *)&local_1b8);
  data_02.deleter.m_deviceIface._0_4_ = (int)local_198.deleter.m_deviceIface;
  data_02.object.m_internal = local_198.object.m_internal;
  data_02.deleter.m_deviceIface._4_4_ = (int)((ulong)local_198.deleter.m_deviceIface >> 0x20);
  data_02.deleter.m_device = local_198.deleter.m_device;
  data_02.deleter.m_allocator._0_4_ = (int)local_198.deleter.m_allocator;
  data_02.deleter.m_allocator._4_4_ = (int)((ulong)local_198.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)7>_> *)local_178,data_02);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)7>_>::~Move(&local_1b8);
  bufferBarrier.size._0_4_ = 0x2d;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
            (&(this->m_dstImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>);
  region.imageExtent.height = 0x2c;
  bufferBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  bufferBarrier._4_4_ = 0;
  bufferBarrier.pNext._0_4_ = 0x1000;
  bufferBarrier.pNext._4_4_ = 0x2000;
  bufferBarrier.srcAccessMask = 0xffffffff;
  bufferBarrier.dstAccessMask = 0xffffffff;
  pHVar7 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)8>_> *)local_118);
  bufferBarrier._24_8_ = pHVar7->m_internal;
  bufferBarrier.buffer.m_internal = 0;
  bufferBarrier.offset = 0xffffffffffffffff;
  local_278 = 0;
  region.bufferOffset._0_4_ = 0;
  region.bufferOffset._4_4_ = 0;
  region.bufferRowLength = 1;
  region.bufferImageHeight = 0;
  region.imageSubresource.aspectMask = 0;
  region.imageSubresource.mipLevel = 1;
  region.imageSubresource.baseArrayLayer = 0;
  region.imageSubresource.layerCount = 0;
  region.imageOffset.x = 0;
  region.imageOffset.y = this->m_imageWidth;
  region.imageOffset.z = this->m_imageHeight;
  region.imageExtent.width = 1;
  ppVVar8 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_80);
  (*vkd_00->_vptr_DeviceInterface[0x6d])
            (vkd_00,*ppVVar8,0x1000,0x1000,0,0,0,0,0,1,&bufferBarrier.size);
  ppVVar8 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_80);
  pVVar1 = *ppVVar8;
  pHVar9 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                     (&(this->m_dstImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>);
  local_280 = pHVar9->m_internal;
  pHVar7 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)8>_> *)local_118);
  ptr = (void *)pHVar7->m_internal;
  (*vkd_00->_vptr_DeviceInterface[99])(vkd_00,pVVar1,local_280,6,ptr,1,(int)&local_278);
  ppVVar8 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_80);
  (*vkd_00->_vptr_DeviceInterface[0x6d])
            (vkd_00,*ppVVar8,0x1000,0x4000,0,0,0,1,&region.imageExtent.height,0,0);
  ppVVar8 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_80);
  result = (*vkd_00->_vptr_DeviceInterface[0x4a])(vkd_00,*ppVVar8);
  ::vk::checkResult(result,"vkd.endCommandBuffer(*commandBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/memory/vktMemoryPipelineBarrierTests.cpp"
                    ,0xa77);
  ppVVar8 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_80);
  queueRun(vkd_00,queue_00,*ppVVar8);
  pHVar10 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)7>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)7>_> *)local_178);
  local_298 = pHVar10->m_internal;
  local_290 = mapMemory(vkd_00,device_00,(VkDeviceMemory)local_298,
                        (long)(this->m_imageWidth * this->m_imageHeight * 4));
  pHVar10 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)7>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)7>_> *)local_178);
  data = (deUint8 *)pHVar10->m_internal;
  ::vk::invalidateMappedMemoryRange
            (vkd_00,device_00,(VkDeviceMemory)data,0,
             (long)(this->m_imageWidth * this->m_imageHeight * 4));
  pos = (size_t)local_290;
  local_2b0 = 0;
  do {
    if ((ulong)(long)(this->m_imageWidth * 4 * this->m_imageHeight) <= local_2b0) {
LAB_00be844b:
      pHVar10 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)7>_>::operator*
                          ((RefBase<vk::Handle<(vk::HandleType)7>_> *)local_178);
      (*vkd_00->_vptr_DeviceInterface[8])(vkd_00,device_00,pHVar10->m_internal);
      ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>::~Unique
                ((Unique<vk::Handle<(vk::HandleType)7>_> *)local_178);
      ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>::~Unique
                ((Unique<vk::Handle<(vk::HandleType)8>_> *)local_118);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 &dstBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator
                );
      ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::~Unique
                ((Unique<vk::VkCommandBuffer_s_*> *)local_80);
      return extraout_EAX;
    }
    bVar2 = ReferenceMemory::isDefined(this_01,local_2b0);
    if ((bVar2) &&
       (dVar4 = *(deUint8 *)(pos + local_2b0), dVar3 = ReferenceMemory::get(this_01,local_2b0),
       dVar4 != dVar3)) {
      de::toString<unsigned_long>(&local_3d0,(unsigned_long *)&resultCollector);
      std::operator+(&local_3b0,&local_3d0,":");
      iVar5 = (*(this->super_CmdCommand)._vptr_CmdCommand[2])();
      std::operator+(&local_390,&local_3b0,(char *)CONCAT44(extraout_var,iVar5));
      std::operator+(&local_370,&local_390," Result differs from reference, Expected: ");
      dVar4 = ReferenceMemory::get(this_01,local_2b0);
      local_3f8 = (deUint64)tcu::toHex<8ul,unsigned_char>(dVar4);
      de::toString<tcu::Format::Hex<8ul>>(&local_3f0,(de *)&local_3f8,value);
      std::operator+(&local_350,&local_370,&local_3f0);
      std::operator+(&local_330,&local_350,", Got: ");
      local_420 = (deUint64)tcu::toHex<8ul,unsigned_char>(*(uchar *)(pos + local_2b0));
      de::toString<tcu::Format::Hex<8ul>>(&local_418,(de *)&local_420,value_00);
      std::operator+(&local_310,&local_330,&local_418);
      std::operator+(&local_2f0,&local_310,", At offset: ");
      de::toString<unsigned_long>(&local_440,&local_2b0);
      std::operator+(&local_2d0,&local_2f0,&local_440);
      tcu::ResultCollector::fail(this_00,&local_2d0);
      std::__cxx11::string::~string((string *)&local_2d0);
      std::__cxx11::string::~string((string *)&local_440);
      std::__cxx11::string::~string((string *)&local_2f0);
      std::__cxx11::string::~string((string *)&local_310);
      std::__cxx11::string::~string((string *)&local_418);
      std::__cxx11::string::~string((string *)&local_330);
      std::__cxx11::string::~string((string *)&local_350);
      std::__cxx11::string::~string((string *)&local_3f0);
      std::__cxx11::string::~string((string *)&local_370);
      std::__cxx11::string::~string((string *)&local_390);
      std::__cxx11::string::~string((string *)&local_3b0);
      std::__cxx11::string::~string((string *)&local_3d0);
      goto LAB_00be844b;
    }
    local_2b0 = local_2b0 + 1;
  } while( true );
}

Assistant:

void BufferCopyToImage::verify (VerifyContext& context, size_t commandIndex)
{
	tcu::ResultCollector&					resultCollector	(context.getResultCollector());
	ReferenceMemory&						reference		(context.getReference());
	const vk::InstanceInterface&			vki				= context.getContext().getInstanceInterface();
	const vk::DeviceInterface&				vkd				= context.getContext().getDeviceInterface();
	const vk::VkPhysicalDevice				physicalDevice	= context.getContext().getPhysicalDevice();
	const vk::VkDevice						device			= context.getContext().getDevice();
	const vk::VkQueue						queue			= context.getContext().getQueue();
	const vk::VkCommandPool					commandPool		= context.getContext().getCommandPool();
	const vk::Unique<vk::VkCommandBuffer>	commandBuffer	(createBeginCommandBuffer(vkd, device, commandPool, vk::VK_COMMAND_BUFFER_LEVEL_PRIMARY));
	const vector<deUint32>&					queueFamilies	= context.getContext().getQueueFamilies();
	const vk::Unique<vk::VkBuffer>			dstBuffer		(createBuffer(vkd, device, 4 * m_imageWidth * m_imageHeight, vk::VK_BUFFER_USAGE_TRANSFER_DST_BIT, vk::VK_SHARING_MODE_EXCLUSIVE, queueFamilies));
	const vk::Unique<vk::VkDeviceMemory>	memory			(bindBufferMemory(vki, vkd, physicalDevice, device, *dstBuffer, vk::VK_MEMORY_PROPERTY_HOST_VISIBLE_BIT));
	{
		const vk::VkImageMemoryBarrier		imageBarrier	=
		{
			vk::VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,
			DE_NULL,

			vk::VK_ACCESS_TRANSFER_WRITE_BIT,
			vk::VK_ACCESS_TRANSFER_READ_BIT,

			vk::VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
			vk::VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,

			VK_QUEUE_FAMILY_IGNORED,
			VK_QUEUE_FAMILY_IGNORED,

			*m_dstImage,
			{
				vk::VK_IMAGE_ASPECT_COLOR_BIT,
				0,	// Mip level
				1,	// Mip level count
				0,	// Layer
				1	// Layer count
			}
		};
		const vk::VkBufferMemoryBarrier bufferBarrier =
		{
			vk::VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER,
			DE_NULL,

			vk::VK_ACCESS_TRANSFER_WRITE_BIT,
			vk::VK_ACCESS_HOST_READ_BIT,

			VK_QUEUE_FAMILY_IGNORED,
			VK_QUEUE_FAMILY_IGNORED,
			*dstBuffer,
			0,
			VK_WHOLE_SIZE
		};

		const vk::VkBufferImageCopy	region =
		{
			0,
			0, 0,
			{
				vk::VK_IMAGE_ASPECT_COLOR_BIT,
				0,	// mipLevel
				0,	// arrayLayer
				1	// layerCount
			},
			{ 0, 0, 0 },
			{
				(deUint32)m_imageWidth,
				(deUint32)m_imageHeight,
				1u
			}
		};

		vkd.cmdPipelineBarrier(*commandBuffer, vk::VK_PIPELINE_STAGE_TRANSFER_BIT, vk::VK_PIPELINE_STAGE_TRANSFER_BIT, (vk::VkDependencyFlags)0, 0, (const vk::VkMemoryBarrier*)DE_NULL, 0, (const vk::VkBufferMemoryBarrier*)DE_NULL, 1, &imageBarrier);
		vkd.cmdCopyImageToBuffer(*commandBuffer, *m_dstImage, vk::VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL, *dstBuffer, 1, &region);
		vkd.cmdPipelineBarrier(*commandBuffer, vk::VK_PIPELINE_STAGE_TRANSFER_BIT, vk::VK_PIPELINE_STAGE_HOST_BIT, (vk::VkDependencyFlags)0, 0, (const vk::VkMemoryBarrier*)DE_NULL, 1, &bufferBarrier, 0, (const vk::VkImageMemoryBarrier*)DE_NULL);
	}

	VK_CHECK(vkd.endCommandBuffer(*commandBuffer));
	queueRun(vkd, queue, *commandBuffer);

	{
		void* const	ptr		= mapMemory(vkd, device, *memory, 4 * m_imageWidth * m_imageHeight);

		vk::invalidateMappedMemoryRange(vkd, device, *memory, 0,  4 * m_imageWidth * m_imageHeight);

		{
			const deUint8* const	data = (const deUint8*)ptr;

			for (size_t pos = 0; pos < (size_t)( 4 * m_imageWidth * m_imageHeight); pos++)
			{
				if (reference.isDefined(pos))
				{
					if (data[pos] != reference.get(pos))
					{
						resultCollector.fail(
								de::toString(commandIndex) + ":" + getName()
								+ " Result differs from reference, Expected: "
								+ de::toString(tcu::toHex<8>(reference.get(pos)))
								+ ", Got: "
								+ de::toString(tcu::toHex<8>(data[pos]))
								+ ", At offset: "
								+ de::toString(pos));
						break;
					}
				}
			}
		}

		vkd.unmapMemory(device, *memory);
	}
}